

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signet.cpp
# Opt level: O3

bool CheckSignetBlockSolution(CBlock *block,Params *consensusParams)

{
  CTransaction *txTo;
  bool bVar1;
  bool bVar2;
  Logger *pLVar3;
  long in_FS_OFFSET;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  initializer_list<CTxOut> __l;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  allocator_type local_2c9;
  vector<CTxOut,_std::allocator<CTxOut>_> local_2c8;
  TransactionSignatureChecker sigcheck;
  PrecomputedTransactionData txdata;
  optional<SignetTxs> signet_txs;
  direct_or_indirect local_58;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CBlockHeader::GetHash(&txdata.m_prevouts_single_hash,&block->super_CBlockHeader);
  auVar5[0] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[0] ==
               txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0]);
  auVar5[1] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[1] ==
               txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[1]);
  auVar5[2] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[2] ==
               txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[2]);
  auVar5[3] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[3] ==
               txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[3]);
  auVar5[4] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[4] ==
               txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[4]);
  auVar5[5] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[5] ==
               txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[5]);
  auVar5[6] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[6] ==
               txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[6]);
  auVar5[7] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[7] ==
               txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[7]);
  auVar5[8] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[8] ==
               txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[8]);
  auVar5[9] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[9] ==
               txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[9]);
  auVar5[10] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[10] ==
                txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[10]);
  auVar5[0xb] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[0xb] ==
                 txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar5[0xc] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[0xc] ==
                 txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar5[0xd] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[0xd] ==
                 txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar5[0xe] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[0xe] ==
                 txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar5[0xf] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[0xf] ==
                 txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar4[0] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[0x10] ==
               txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x10]);
  auVar4[1] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[0x11] ==
               txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x11]);
  auVar4[2] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[0x12] ==
               txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x12]);
  auVar4[3] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[0x13] ==
               txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x13]);
  auVar4[4] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[0x14] ==
               txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x14]);
  auVar4[5] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[0x15] ==
               txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x15]);
  auVar4[6] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[0x16] ==
               txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x16]);
  auVar4[7] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[0x17] ==
               txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x17]);
  auVar4[8] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[0x18] ==
               txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x18]);
  auVar4[9] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[0x19] ==
               txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x19]);
  auVar4[10] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[0x1a] ==
                txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1a]);
  auVar4[0xb] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[0x1b] ==
                 txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1b]);
  auVar4[0xc] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[0x1c] ==
                 txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1c]);
  auVar4[0xd] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[0x1d] ==
                 txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1d]);
  auVar4[0xe] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[0x1e] ==
                 txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1e]);
  auVar4[0xf] = -((consensusParams->hashGenesisBlock).super_base_blob<256U>.m_data._M_elems[0x1f] ==
                 txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1f]);
  auVar4 = auVar4 & auVar5;
  if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar4[0xf] >> 7) << 0xf) == 0xffff) {
    bVar1 = true;
  }
  else {
    prevector<28U,_unsigned_char,_unsigned_int,_int>::
    prevector<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_58.indirect_contents,
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(consensusParams->signet_challenge).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(consensusParams->signet_challenge).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    SignetTxs::Create(&signet_txs,block,(CScript *)&local_58.indirect_contents);
    if (signet_txs.super__Optional_base<SignetTxs,_false,_false>._M_payload.
        super__Optional_payload<SignetTxs,_true,_false,_false>.
        super__Optional_payload_base<SignetTxs>._M_engaged == false) {
      pLVar3 = LogInstance();
      bVar1 = BCLog::Logger::WillLogCategoryLevel(pLVar3,VALIDATION,Debug);
      if (bVar1) {
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/signet.cpp"
        ;
        source_file_00._M_len = 0x5a;
        logging_function_00._M_str = "CheckSignetBlockSolution";
        logging_function_00._M_len = 0x18;
        LogPrintFormatInternal<>
                  (logging_function_00,source_file_00,0x88,VALIDATION,Debug,
                   (ConstevalFormatString<0U>)0xfae608);
      }
      bVar1 = false;
    }
    else {
      memset(&txdata,0,0x102);
      txdata.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
      super__Vector_impl_data._0_9_ = SUB169((undefined1  [16])0x0,0);
      txdata.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
      super__Vector_impl_data._M_finish._1_7_ = 0;
      txdata._280_9_ = SUB169((undefined1  [16])0x0,7);
      sigcheck.super_BaseSignatureChecker._vptr_BaseSignatureChecker =
           (_func_int **)
           (signet_txs.super__Optional_base<SignetTxs,_false,_false>._M_payload.
            super__Optional_payload<SignetTxs,_true,_false,_false>.
            super__Optional_payload_base<SignetTxs>._M_payload._M_value.m_to_spend.vout.
            super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
           _M_start)->nValue;
      prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&sigcheck.txTo,
                 &((signet_txs.super__Optional_base<SignetTxs,_false,_false>._M_payload.
                    super__Optional_payload<SignetTxs,_true,_false,_false>.
                    super__Optional_payload_base<SignetTxs>._M_payload._M_value.m_to_spend.vout.
                    super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                    super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase);
      __l._M_len = 1;
      __l._M_array = (iterator)&sigcheck;
      std::vector<CTxOut,_std::allocator<CTxOut>_>::vector(&local_2c8,__l,&local_2c9);
      txTo = &signet_txs.super__Optional_base<SignetTxs,_false,_false>._M_payload.
              super__Optional_payload<SignetTxs,_true,_false,_false>.
              super__Optional_payload_base<SignetTxs>._M_payload._M_value.m_to_sign;
      PrecomputedTransactionData::Init<CTransaction>(&txdata,txTo,&local_2c8,false);
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_2c8);
      if (0x1c < sigcheck.txdata._4_4_) {
        free(sigcheck.txTo);
      }
      sigcheck.super_BaseSignatureChecker._vptr_BaseSignatureChecker =
           (_func_int **)&PTR_CheckECDSASignature_0138d8a0;
      sigcheck.m_mdb = ASSERT_FAIL;
      sigcheck.nIn = 0;
      sigcheck.amount =
           (signet_txs.super__Optional_base<SignetTxs,_false,_false>._M_payload.
            super__Optional_payload<SignetTxs,_true,_false,_false>.
            super__Optional_payload_base<SignetTxs>._M_payload._M_value.m_to_spend.vout.
            super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
           _M_start)->nValue;
      sigcheck.txTo = txTo;
      sigcheck.txdata = &txdata;
      bVar1 = VerifyScript(&(signet_txs.super__Optional_base<SignetTxs,_false,_false>._M_payload.
                             super__Optional_payload<SignetTxs,_true,_false,_false>.
                             super__Optional_payload_base<SignetTxs>._M_payload._M_value.m_to_sign.
                             vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                             super__Vector_impl_data._M_start)->scriptSig,
                           &(signet_txs.super__Optional_base<SignetTxs,_false,_false>._M_payload.
                             super__Optional_payload<SignetTxs,_true,_false,_false>.
                             super__Optional_payload_base<SignetTxs>._M_payload._M_value.m_to_spend.
                             vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                             super__Vector_impl_data._M_start)->scriptPubKey,
                           &(signet_txs.super__Optional_base<SignetTxs,_false,_false>._M_payload.
                             super__Optional_payload<SignetTxs,_true,_false,_false>.
                             super__Optional_payload_base<SignetTxs>._M_payload._M_value.m_to_sign.
                             vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                             super__Vector_impl_data._M_start)->scriptWitness,0x815,
                           &sigcheck.super_BaseSignatureChecker,(ScriptError *)0x0);
      if (!bVar1) {
        pLVar3 = LogInstance();
        bVar2 = BCLog::Logger::WillLogCategoryLevel(pLVar3,VALIDATION,Debug);
        if (bVar2) {
          source_file._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/signet.cpp"
          ;
          source_file._M_len = 0x5a;
          logging_function._M_str = "CheckSignetBlockSolution";
          logging_function._M_len = 0x18;
          LogPrintFormatInternal<>
                    (logging_function,source_file,0x94,VALIDATION,Debug,
                     (ConstevalFormatString<0U>)0xfae652);
        }
      }
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&txdata.m_spent_outputs);
    }
    if (signet_txs.super__Optional_base<SignetTxs,_false,_false>._M_payload.
        super__Optional_payload<SignetTxs,_true,_false,_false>.
        super__Optional_payload_base<SignetTxs>._M_engaged == true) {
      std::_Optional_payload_base<SignetTxs>::_M_destroy
                ((_Optional_payload_base<SignetTxs> *)&signet_txs);
    }
    if (0x1c < local_3c) {
      free(local_58.indirect_contents.indirect);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CheckSignetBlockSolution(const CBlock& block, const Consensus::Params& consensusParams)
{
    if (block.GetHash() == consensusParams.hashGenesisBlock) {
        // genesis block solution is always valid
        return true;
    }

    const CScript challenge(consensusParams.signet_challenge.begin(), consensusParams.signet_challenge.end());
    const std::optional<SignetTxs> signet_txs = SignetTxs::Create(block, challenge);

    if (!signet_txs) {
        LogDebug(BCLog::VALIDATION, "CheckSignetBlockSolution: Errors in block (block solution parse failure)\n");
        return false;
    }

    const CScript& scriptSig = signet_txs->m_to_sign.vin[0].scriptSig;
    const CScriptWitness& witness = signet_txs->m_to_sign.vin[0].scriptWitness;

    PrecomputedTransactionData txdata;
    txdata.Init(signet_txs->m_to_sign, {signet_txs->m_to_spend.vout[0]});
    TransactionSignatureChecker sigcheck(&signet_txs->m_to_sign, /* nInIn= */ 0, /* amountIn= */ signet_txs->m_to_spend.vout[0].nValue, txdata, MissingDataBehavior::ASSERT_FAIL);

    if (!VerifyScript(scriptSig, signet_txs->m_to_spend.vout[0].scriptPubKey, &witness, BLOCK_SCRIPT_VERIFY_FLAGS, sigcheck)) {
        LogDebug(BCLog::VALIDATION, "CheckSignetBlockSolution: Errors in block (block solution invalid)\n");
        return false;
    }
    return true;
}